

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O3

void __thiscall deqp::gles3::Functional::VertexIDCase::deinit(VertexIDCase *this)

{
  ShaderProgram *this_00;
  pointer pVVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
  }
  operator_delete(this_00,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  if (this->m_positionBuffer != 0) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x438))(1,&this->m_positionBuffer);
    this->m_positionBuffer = 0;
  }
  if (this->m_elementBuffer != 0) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x438))(1,&this->m_elementBuffer);
    this->m_elementBuffer = 0;
  }
  pVVar1 = (this->m_positions).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->m_positions).
    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  pVVar1 = (this->m_colors).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->m_colors).
    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  return;
}

Assistant:

void VertexIDCase::deinit (void)
{
	delete m_program;
	m_program = DE_NULL;

	if (m_positionBuffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_positionBuffer);
		m_positionBuffer = 0;
	}

	if (m_elementBuffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_elementBuffer);
		m_elementBuffer = 0;
	}

	m_positions.clear();
	m_colors.clear();
}